

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void error_report(string *message)

{
  ostream *poVar1;
  string *message_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"ERROR!\t");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  error_count = error_count + 1;
  return;
}

Assistant:

void error_report(std::string message)
{
	std::cerr << std::endl << "ERROR!\t" << message << std::endl;
	error_count++;
}